

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int print_reasons(BIO *out,char *rname,ASN1_BIT_STRING *rflags,int indent)

{
  bool bVar1;
  int iVar2;
  BIT_STRING_BITNAME *local_30;
  BIT_STRING_BITNAME *pbn;
  int first;
  int indent_local;
  ASN1_BIT_STRING *rflags_local;
  char *rname_local;
  BIO *out_local;
  
  bVar1 = true;
  BIO_printf((BIO *)out,"%*s%s:\n%*s",(ulong)(uint)indent,"",rname,(ulong)(indent + 2),"");
  for (local_30 = reason_flags; local_30->lname != (char *)0x0; local_30 = local_30 + 1) {
    iVar2 = ASN1_BIT_STRING_get_bit((ASN1_BIT_STRING *)rflags,local_30->bitnum);
    if (iVar2 != 0) {
      if (bVar1) {
        bVar1 = false;
      }
      else {
        BIO_puts((BIO *)out,", ");
      }
      BIO_puts((BIO *)out,local_30->lname);
    }
  }
  if (bVar1) {
    BIO_puts((BIO *)out,"<EMPTY>\n");
  }
  else {
    BIO_puts((BIO *)out,"\n");
  }
  return 1;
}

Assistant:

static int print_reasons(BIO *out, const char *rname, ASN1_BIT_STRING *rflags,
                         int indent) {
  int first = 1;
  const BIT_STRING_BITNAME *pbn;
  BIO_printf(out, "%*s%s:\n%*s", indent, "", rname, indent + 2, "");
  for (pbn = reason_flags; pbn->lname; pbn++) {
    if (ASN1_BIT_STRING_get_bit(rflags, pbn->bitnum)) {
      if (first) {
        first = 0;
      } else {
        BIO_puts(out, ", ");
      }
      BIO_puts(out, pbn->lname);
    }
  }
  if (first) {
    BIO_puts(out, "<EMPTY>\n");
  } else {
    BIO_puts(out, "\n");
  }
  return 1;
}